

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::ContextScopeBase::ContextScopeBase(ContextScopeBase *this)

{
  vector<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_> *this_00;
  value_type local_18;
  ContextScopeBase *local_10;
  ContextScopeBase *this_local;
  
  local_10 = this;
  IContextScope::IContextScope(&this->super_IContextScope);
  (this->super_IContextScope)._vptr_IContextScope = (_func_int **)&PTR__ContextScopeBase_0019abf0;
  this_00 = (vector<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_> *)
            g_infoContexts();
  local_18 = &this->super_IContextScope;
  std::vector<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_>::push_back
            (this_00,&local_18);
  return;
}

Assistant:

ContextScopeBase::ContextScopeBase() {
        g_infoContexts.push_back(this);
    }